

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

void Gia_ObjSetGateLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pObj_00;
  
  if ((p->fGiaSimple == 0) && (iVar2 = Gia_ObjIsBuf(pObj), iVar2 != 0)) {
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar4 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar4 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x240,"void Gia_ObjSetBufLevel(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar2 = Gia_ObjLevel(p,pObj + -(ulong)uVar4);
  }
  else {
    iVar2 = Gia_ObjIsMux(p,pObj);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsXor(pObj);
      uVar1 = *(ulong *)pObj;
      if (iVar2 == 0) {
        if ((uVar1 & 0x1fffffff) == 0x1fffffff || (int)uVar1 < 0) {
          return;
        }
        iVar3 = Gia_ObjLevel(p,pObj + -(uVar1 & 0x1fffffff));
        iVar2 = Gia_ObjLevel(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
        if (iVar2 < iVar3) {
          iVar2 = iVar3;
        }
        iVar2 = iVar2 + 1;
        goto LAB_005a4f3e;
      }
      iVar3 = Gia_ObjLevel(p,pObj + -(uVar1 & 0x1fffffff));
      iVar2 = Gia_ObjLevel(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
      if (iVar2 < iVar3) {
        iVar2 = iVar3;
      }
    }
    else {
      iVar2 = Gia_ObjIsMux(p,pObj);
      if (iVar2 == 0) {
        __assert_fail("Gia_ObjIsMux(p,pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x243,"void Gia_ObjSetMuxLevel(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar3 = Gia_ObjLevel(p,pObj + -(*(ulong *)pObj & 0x1fffffff));
      iVar2 = Gia_ObjLevel(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
      if (iVar2 < iVar3) {
        iVar2 = iVar3;
      }
      pObj_00 = Gia_ObjFanin2(p,pObj);
      iVar3 = Gia_ObjLevel(p,pObj_00);
      if (iVar2 <= iVar3) {
        iVar2 = iVar3;
      }
    }
    iVar2 = iVar2 + 2;
  }
LAB_005a4f3e:
  Gia_ObjSetLevel(p,pObj,iVar2);
  return;
}

Assistant:

static inline void         Gia_ObjSetGateLevel( Gia_Man_t * p, Gia_Obj_t * pObj ){ if ( !p->fGiaSimple && Gia_ObjIsBuf(pObj) ) Gia_ObjSetBufLevel(p, pObj); else if ( Gia_ObjIsMux(p,pObj) ) Gia_ObjSetMuxLevel(p, pObj); else if ( Gia_ObjIsXor(pObj) ) Gia_ObjSetXorLevel(p, pObj); else if ( Gia_ObjIsAnd(pObj) ) Gia_ObjSetAndLevel(p, pObj); }